

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O1

string * pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::TypeName_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  *(undefined4 *)&in_RDI->field_2 = 0x61727950;
  *(undefined4 *)((long)&in_RDI->field_2 + 3) = 0x64696d61;
  in_RDI->_M_string_length = 7;
  (in_RDI->field_2)._M_local_buf[7] = '\0';
  return in_RDI;
}

Assistant:

static std::string TypeName() { return TGeo::TypeName(); }